

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::contextCallbackOverrideInit
          (CLIntercept *this,cl_context_properties *properties,
          _func_void_char_ptr_void_ptr_size_t_void_ptr **pCallback,void **pUserData,
          SContextCallbackInfo **pContextCallbackInfo,
          cl_context_properties **pLocalContextProperties)

{
  bool bVar1;
  SContextCallbackInfo *pSVar2;
  ulong uVar3;
  cl_context_properties *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if ((this->m_Config).ContextCallbackLogging == true) {
    pSVar2 = (SContextCallbackInfo *)operator_new(0x18);
    *pContextCallbackInfo = pSVar2;
    pSVar2->pIntercept = this;
    pSVar2->pApplicationCallback = *pCallback;
    pSVar2->pUserData = *pUserData;
    *pCallback = contextCallbackCaller;
    *pUserData = *pContextCallbackInfo;
  }
  uVar8 = (ulong)(this->m_Config).ContextHintLevel;
  if (uVar8 == 0) {
    return;
  }
  if (properties != (cl_context_properties *)0x0) {
    bVar1 = false;
    uVar3 = 0;
    do {
      if (properties[uVar3] == 0x4106) {
        bVar1 = true;
      }
      else if (properties[uVar3] == 0) goto LAB_0016f6ad;
      uVar3 = uVar3 + 2;
    } while( true );
  }
  pcVar4 = (cl_context_properties *)operator_new__(0x18);
  *pLocalContextProperties = pcVar4;
  lVar7 = 0;
LAB_0016f72a:
  pcVar4[lVar7] = 0x4106;
  pcVar4[lVar7 + 1] = uVar8;
  lVar7 = lVar7 + 2;
LAB_0016f73b:
  pcVar4[lVar7] = 0;
  return;
LAB_0016f6ad:
  uVar5 = uVar3 + 2;
  if (bVar1) {
    uVar5 = uVar3;
  }
  lVar7 = 0;
  pcVar4 = (cl_context_properties *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3 | 8);
  *pLocalContextProperties = pcVar4;
  lVar6 = *properties;
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      pcVar4[lVar7] = lVar6;
      uVar3 = uVar8;
      if (lVar6 != 0x4106) {
        uVar3 = properties[lVar7 + 1];
      }
      pcVar4[lVar7 + 1] = uVar3;
      lVar6 = properties[lVar7 + 2];
      lVar7 = lVar7 + 2;
    } while (lVar6 != 0);
  }
  if (bVar1) goto LAB_0016f73b;
  goto LAB_0016f72a;
}

Assistant:

void CLIntercept::contextCallbackOverrideInit(
    const cl_context_properties* properties,
    void (CL_CALLBACK*& pCallback)( const char*, const void*, size_t, void* ),
    void*& pUserData,
    SContextCallbackInfo*& pContextCallbackInfo,
    cl_context_properties*& pLocalContextProperties )
{
    if( m_Config.ContextCallbackLogging )
    {
        pContextCallbackInfo = new SContextCallbackInfo;
        if( pContextCallbackInfo )
        {
            pContextCallbackInfo->pIntercept = this;
            pContextCallbackInfo->pApplicationCallback = pCallback;
            pContextCallbackInfo->pUserData = pUserData;

            pCallback = CLIntercept::contextCallbackCaller;
            pUserData = pContextCallbackInfo;
        }
    }

    if( m_Config.ContextHintLevel )
    {
        // We want to add a context hints to the context properties, unless
        // the context properties already requests performance hints
        // (requesting the same property twice is an error).  So, look through
        // the context properties for the performance hint enum.  We need to
        // do this anyways to count the number of property pairs.
        bool    foundPerformanceHintEnum = false;
        size_t  numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                if( properties[ numProperties ] == CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL )
                {
                    foundPerformanceHintEnum = true;
                }
                numProperties += 2;
            }
        }

        if( foundPerformanceHintEnum == false )
        {
            // The performance hint property isn't already set, so we'll
            // need to allocate an extra pair of properties for it.
            numProperties += 2;
        }

        // Allocate a new array of properties.  We need to allocate two
        // properties for each pair, plus one property for the terminating
        // zero.
        pLocalContextProperties = new cl_context_properties[ numProperties + 1 ];
        if( pLocalContextProperties )
        {
            // Copy the old properties array to the new properties array,
            // if the new properties array exists.
            numProperties = 0;
            if( properties )
            {
                while( properties[ numProperties ] != 0 )
                {
                    pLocalContextProperties[ numProperties ] = properties[ numProperties ];
                    if( properties[ numProperties ] == CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL )
                    {
                        CLI_ASSERT( foundPerformanceHintEnum );
                        pLocalContextProperties[ numProperties + 1 ] = m_Config.ContextHintLevel;
                    }
                    else
                    {
                        pLocalContextProperties[ numProperties + 1 ] = properties[ numProperties + 1 ];
                    }
                    numProperties += 2;
                }
            }
            // Add the performance hint property if it wasn't already set.
            if( foundPerformanceHintEnum == false )
            {
                pLocalContextProperties[ numProperties ] = CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL;
                pLocalContextProperties[ numProperties + 1 ] = m_Config.ContextHintLevel;
                numProperties += 2;
            }
            // Add the terminating zero.
            pLocalContextProperties[ numProperties ] = 0;
        }
    }
}